

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

size_t __thiscall
vectorstr_hash::operator()
          (vectorstr_hash *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *p)

{
  size_type sVar1;
  ulong uVar2;
  const_reference pvVar3;
  char *pcVar4;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  longlong hash_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_local;
  vectorstr_hash *this_local;
  
  _j = 1;
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(p);
    if (sVar1 <= (ulong)(long)local_24) break;
    local_28 = 0;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](p,(long)local_24);
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= (ulong)(long)local_28) break;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](p,(long)local_24);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      _j = (long)(_j * (long)*pcVar4) % 0x5f5e0fd;
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  return _j;
}

Assistant:

std::size_t operator () (const std::vector<string> &p) const
	{
		long long hash_value = 1;
		for (auto i = 0; i < p.size(); i ++)
			for (auto j = 0; j < p[i].size(); j ++)
				hash_value = (long long) hash_value * (long long) p[i][j] % 99999997LL;

		return (size_t) hash_value;
	}